

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineColorWriteCreateInfoEXT *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value,
               DynamicStateInfo *dynamic_state_info)

{
  GenericStringRef<char> local_90;
  uint local_7c;
  undefined1 local_78 [4];
  uint32_t i;
  Value enables;
  GenericStringRef<char> local_60;
  GenericStringRef<char> local_50;
  undefined1 local_40 [8];
  Value value;
  DynamicStateInfo *dynamic_state_info_local;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPipelineColorWriteCreateInfoEXT *create_info_local;
  
  value.data_.o.members = (Member *)dynamic_state_info;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_40,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_50,(char (*) [6])0x3cdd46);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,&local_50,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<16u>
            (&local_60,(char (*) [16])"attachmentCount");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,&local_60,create_info->attachmentCount,alloc);
  if (value.data_.s.str == (Ch *)0x0) {
    create_info_local._7_1_ = false;
  }
  else {
    if ((create_info->pColorWriteEnables != (VkBool32 *)0x0) &&
       ((((value.data_.o.members)->value).data_.ss.str[9] & 1U) == 0)) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_78,kArrayType);
      for (local_7c = 0; local_7c < create_info->attachmentCount; local_7c = local_7c + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack<unsigned_int>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_78,create_info->pColorWriteEnables[local_7c],alloc);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<18u>
                (&local_90,(char (*) [18])"colorWriteEnables");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,&local_90,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_78,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_78);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    operator=(out_value,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_40);
    create_info_local._7_1_ = true;
  }
  enables.data_._12_4_ = 1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_40);
  return create_info_local._7_1_;
}

Assistant:

static bool json_value(const VkPipelineColorWriteCreateInfoEXT &create_info, Allocator &alloc, Value *out_value,
                       const DynamicStateInfo *dynamic_state_info)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("attachmentCount", create_info.attachmentCount, alloc);

	if (!dynamic_state_info)
		return false;

	if (create_info.pColorWriteEnables && !dynamic_state_info->color_write_enable)
	{
		Value enables(kArrayType);
		for (uint32_t i = 0; i < create_info.attachmentCount; i++)
			enables.PushBack(uint32_t(create_info.pColorWriteEnables[i]), alloc);
		value.AddMember("colorWriteEnables", enables, alloc);
	}

	*out_value = value;
	return true;
}